

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator1.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  undefined8 *puVar2;
  void *pvVar3;
  SkipListIterator<Employee_*> iterator;
  ReverseListIterator<Employee_*> backward;
  ListIterator<Employee_*> forward;
  Iterator<Employee_*> local_60;
  long *local_58;
  undefined8 local_50;
  Iterator<Employee_*> local_48;
  long *local_40;
  long local_38;
  Iterator<Employee_*> local_30;
  long *local_28;
  undefined8 local_20;
  
  plVar1 = (long *)operator_new(0x18);
  plVar1[1] = 200;
  plVar1[2] = 0;
  puVar2 = (undefined8 *)operator_new__(0x640);
  *plVar1 = (long)puVar2;
  pvVar3 = operator_new(1);
  *puVar2 = pvVar3;
  plVar1[2] = 1;
  pvVar3 = operator_new(1);
  puVar2[1] = pvVar3;
  plVar1[2] = 2;
  pvVar3 = operator_new(1);
  *(void **)(*plVar1 + 0x10) = pvVar3;
  plVar1[2] = 3;
  local_30._vptr_Iterator = (_func_int **)&PTR_First_00103cb8;
  local_20 = 0;
  local_48._vptr_Iterator = (_func_int **)&PTR_First_00103d10;
  local_38 = plVar1[2] + -1;
  local_40 = plVar1;
  local_28 = plVar1;
  PrintEmployees(&local_30);
  PrintEmployees(&local_48);
  plVar1 = (long *)operator_new(0x18);
  plVar1[1] = 200;
  plVar1[2] = 0;
  puVar2 = (undefined8 *)operator_new__(0x640);
  *plVar1 = (long)puVar2;
  pvVar3 = operator_new(1);
  *puVar2 = pvVar3;
  plVar1[2] = 1;
  pvVar3 = operator_new(1);
  puVar2[1] = pvVar3;
  plVar1[2] = 2;
  pvVar3 = operator_new(1);
  *(void **)(*plVar1 + 0x10) = pvVar3;
  plVar1[2] = 3;
  local_50 = 0;
  local_60._vptr_Iterator = (_func_int **)&PTR_First_00103d58;
  local_58 = plVar1;
  PrintEmployees(&local_60);
  return 0;
}

Assistant:

int main()
{
    // EXAMPLE 1: List

    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    ListIterator<Employee*> forward(employees);
    ReverseListIterator<Employee*> backward(employees);

    PrintEmployees(forward);
    PrintEmployees(backward);


    // EXAMPLE 2: SkipList

    SkipList<Employee*>* employees2;

    employees2 = new SkipList<Employee*>;
    employees2->Append(new Employee);
    employees2->Append(new Employee);
    employees2->Append(new Employee);

    SkipListIterator<Employee*> iterator(employees2);
    PrintEmployees(iterator);

}